

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::DefParamVisitor,_false,_false,_false,_false>::
visit<slang::ast::VoidType>
          (ASTVisitor<slang::ast::DefParamVisitor,_false,_false,_false,_false> *this,VoidType *t)

{
  VoidType *in_RSI;
  DefParamVisitor *in_RDI;
  
  DefParamVisitor::handle<slang::ast::VoidType>(in_RDI,in_RSI);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }